

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Color ColorAlphaBlend(Color dst,Color src,Color tint)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = (uint)dst >> 8;
  uVar5 = (uint)dst >> 0x10;
  uVar7 = (uint)dst >> 0x18;
  uVar2 = ((uint)tint >> 0x18) * ((uint)src >> 0x18);
  if (0xff < uVar2) {
    uVar2 = uVar2 >> 8;
    uVar4 = uVar2 ^ 0xff;
    uVar6 = (uVar4 * uVar7 >> 8) + uVar2 + 1 & 0xff;
    if (uVar6 == 0) {
      uVar7 = 0;
      dst.r = 0xff;
      dst.g = '\0';
      dst.b = '\0';
      dst.a = '\0';
      uVar1 = 0xff;
      uVar5 = 0xff;
    }
    else {
      dst = SUB84((ulong)(((uint)dst & 0xff) * uVar7 * uVar4 +
                         (((uint)tint & 0xff) * ((uint)src & 0xff) & 0xff00) * (uVar2 + 1)) /
                  (ulong)uVar6 >> 8,0);
      iVar3 = (uVar2 + 1) * 0x100;
      uVar1 = (uint)((ulong)((uVar1 & 0xff) * uVar7 * uVar4 +
                            (((uint)tint >> 8 & 0xff) * ((uint)src >> 8 & 0xff) >> 8) * iVar3) /
                     (ulong)uVar6 >> 8);
      uVar5 = ((uVar5 & 0xff) * uVar7 * uVar4 +
              iVar3 * (((uint)tint >> 0x10 & 0xff) * ((uint)src >> 0x10 & 0xff) >> 8)) / uVar6 >> 8;
      uVar7 = uVar6;
    }
  }
  return (Color)((uint)dst & 0xff | (uVar1 & 0xff) << 8 | (uVar5 & 0xff) << 0x10 | uVar7 << 0x18);
}

Assistant:

Color ColorAlphaBlend(Color dst, Color src, Color tint)
{
    Color out = WHITE;

    // Apply color tint to source color
    src.r = (unsigned char)(((unsigned int)src.r*(unsigned int)tint.r) >> 8);
    src.g = (unsigned char)(((unsigned int)src.g*(unsigned int)tint.g) >> 8);
    src.b = (unsigned char)(((unsigned int)src.b*(unsigned int)tint.b) >> 8);
    src.a = (unsigned char)(((unsigned int)src.a*(unsigned int)tint.a) >> 8);

//#define COLORALPHABLEND_FLOAT
#define COLORALPHABLEND_INTEGERS
#if defined(COLORALPHABLEND_INTEGERS)
    if (src.a == 0) out = dst;
    else if (src.a == 255) out = src;
    else
    {
        unsigned int alpha = (unsigned int)src.a + 1;     // We are shifting by 8 (dividing by 256), so we need to take that excess into account
        out.a = (unsigned char)(((unsigned int)alpha*256 + (unsigned int)dst.a*(256 - alpha)) >> 8);

        if (out.a > 0)
        {
            out.r = (unsigned char)((((unsigned int)src.r*alpha*256 + (unsigned int)dst.r*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
            out.g = (unsigned char)((((unsigned int)src.g*alpha*256 + (unsigned int)dst.g*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
            out.b = (unsigned char)((((unsigned int)src.b*alpha*256 + (unsigned int)dst.b*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
        }
    }
#endif
#if defined(COLORALPHABLEND_FLOAT)
    if (src.a == 0) out = dst;
    else if (src.a == 255) out = src;
    else
    {
        Vector4 fdst = ColorNormalize(dst);
        Vector4 fsrc = ColorNormalize(src);
        Vector4 ftint = ColorNormalize(tint);
        Vector4 fout = { 0 };

        fout.w = fsrc.w + fdst.w*(1.0f - fsrc.w);

        if (fout.w > 0.0f)
        {
            fout.x = (fsrc.x*fsrc.w + fdst.x*fdst.w*(1 - fsrc.w))/fout.w;
            fout.y = (fsrc.y*fsrc.w + fdst.y*fdst.w*(1 - fsrc.w))/fout.w;
            fout.z = (fsrc.z*fsrc.w + fdst.z*fdst.w*(1 - fsrc.w))/fout.w;
        }

        out = (Color){ (unsigned char)(fout.x*255.0f), (unsigned char)(fout.y*255.0f), (unsigned char)(fout.z*255.0f), (unsigned char)(fout.w*255.0f) };
    }
#endif

    return out;
}